

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

SyntaxKind slang::syntax::SyntaxFacts::getModuleDeclarationKind(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 < 0xd9) {
    if (iVar1 == 200) {
      return InterfaceDeclaration;
    }
    if (iVar1 == 0xd5) {
      return ModuleDeclaration;
    }
  }
  else {
    if (iVar1 == 0xd9) {
      return ModuleDeclaration;
    }
    if (iVar1 == 0xe8) {
      return PackageDeclaration;
    }
    if (iVar1 == 0xef) {
      return ProgramDeclaration;
    }
  }
  return Unknown;
}

Assistant:

SyntaxKind SyntaxFacts::getModuleDeclarationKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return SyntaxKind::ModuleDeclaration;
        case TokenKind::MacromoduleKeyword: return SyntaxKind::ModuleDeclaration;
        case TokenKind::ProgramKeyword: return SyntaxKind::ProgramDeclaration;
        case TokenKind::InterfaceKeyword: return SyntaxKind::InterfaceDeclaration;
        case TokenKind::PackageKeyword: return SyntaxKind::PackageDeclaration;
        default: return SyntaxKind::Unknown;
    }
}